

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O2

sexp_conflict
sexp_remquo_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,
                sexp_conflict arg1)

{
  sexp_conflict psVar1;
  sexp_conflict res2;
  sexp_conflict res;
  int tmp2;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  res = (sexp_conflict)0x43e;
  res2 = (sexp_conflict)0x43e;
  psVar1 = arg0;
  if ((((((ulong)arg0 & 3) == 0) && (arg0->tag == 0xb)) && (psVar1 = arg1, ((ulong)arg1 & 3) == 0))
     && (arg1->tag == 0xb)) {
    local_48.next = &local_38;
    local_38.next = (ctx->value).context.saves;
    local_48.var = &res2;
    (ctx->value).context.saves = &local_48;
    local_38.var = &res;
    remquo((arg0->value).flonum,(arg1->value).flonum,&tmp2);
    res = (sexp_conflict)sexp_make_flonum(ctx);
    res2 = (sexp_conflict)sexp_make_integer(ctx,(long)tmp2,(long)(tmp2 >> 0x1f));
    res = (sexp_conflict)sexp_cons_op(ctx,0,2,res,0x23e);
    sexp_push_op(ctx,&res,(res->value).flonum);
    (((res->value).type.cpl)->value).type.name = res2;
    (ctx->value).context.saves = local_38.next;
    return res;
  }
  psVar1 = (sexp_conflict)sexp_type_exception(ctx,self,0xb,psVar1);
  return psVar1;
}

Assistant:

sexp sexp_remquo_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1) {
  int tmp2;
  sexp_gc_var2(res, res2);
  if (! sexp_flonump(arg0))
    return sexp_type_exception(ctx, self, SEXP_FLONUM, arg0);
  if (! sexp_flonump(arg1))
    return sexp_type_exception(ctx, self, SEXP_FLONUM, arg1);
  sexp_gc_preserve2(ctx, res, res2);
  res = sexp_make_flonum(ctx, remquo(sexp_flonum_value(arg0), sexp_flonum_value(arg1), &tmp2));
  res2 = sexp_make_integer(ctx, tmp2);
  res = sexp_cons(ctx, res, SEXP_NULL);
  sexp_push(ctx, res, sexp_car(res));
  sexp_cadr(res) = res2;
  sexp_gc_release2(ctx);
  return res;
}